

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O3

void __thiscall RandomizerWorld::load_teleport_trees(RandomizerWorld *this)

{
  pointer *pppVar1;
  iterator __position;
  bool bVar2;
  reference this_00;
  const_reference pvVar3;
  WorldTeleportTree *pWVar4;
  Json trees_json;
  iterator __end1;
  iterator __begin1;
  pair<WorldTeleportTree_*,_WorldTeleportTree_*> local_b8;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_70;
  iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  uStack_80 = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[1918]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_a8,
             (uchar (*) [1918])
             "[\n    [\n        {\n            \"name\": \"Massan tree\",\n            \"treeMapId\": 512,\n            \"nodeId\": \"route_massan_gumi\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 2 }\n        },\n        {\n            \"name\": \"Tibor tree\",\n            \"treeMapId\": 534,\n            \"nodeId\": \"route_gumi_ryuma\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 3 }\n        }\n    ],\n    [\n        {\n            \"name\": \"Mercator front gate tree\",\n            \"treeMapId\": 539,\n            \"nodeId\": \"route_gumi_ryuma\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 5 }\n        },\n        {\n            \"name\": \"Verla shore tree\",\n            \"treeMapId\": 537,\n            \"nodeId\": \"verla_shore\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 4 }\n        }\n    ],\n    [\n        {\n            \"name\": \"Destel sector tree\",\n            \"treeMapId\": 536,\n            \"nodeId\": \"route_after_destel\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 7 }\n        },\n        {\n            \"name\": \"Lake Shrine sector tree\",\n            \"treeMapId\": 513,\n            \"nodeId\": \"route_lake_shrine\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 6 }\n        }\n    ],\n    [\n        {\n            \"name\": \"Mir Tower sector tree\",\n            \"treeMapId\": 538,\n            \"nodeId\": \"mir_tower_sector\",\n            \"flag\": { \"byte\": \"0x25\", \"bit\": 1 }\n        },\n        {\n            \"name\": \"Mountainous area tree\",\n            \"treeMapId\": 535,\n            \"nodeId\": \"mountainous_area\",\n            \"flag\": { \"byte\": \"0x25\", \"bit\": 0 }\n        }\n    ],\n    [\n        {\n            \"name\": \"Greenmaze entrance tree\",\n            \"treeMapId\": 510,\n            \"nodeId\": \"greenmaze_pre_whistle\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 0 }\n        },\n        {\n            \"name\": \"Greenmaze end tree\",\n            \"treeMapId\": 511,\n            \"nodeId\": \"greenmaze_post_whistle\",\n            \"flag\": { \"byte\": \"0x23\", \"bit\": 1 }\n        }\n    ]\n]"
             ,(parser_callback_t *)&local_98,true,false);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  local_50.m_it.object_iterator._M_current =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x0;
  local_50.m_it.array_iterator._M_current =
       (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_50.m_object = &local_a8;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_begin(&local_50);
  local_70.m_it.object_iterator._M_current =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x0;
  local_70.m_it.array_iterator._M_current =
       (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_70.m_object = &local_a8;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_end(&local_70);
  while( true ) {
    bVar2 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_50,&local_70);
    if (bVar2) break;
    this_00 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*(&local_50);
    pvVar3 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator[](this_00,0);
    pWVar4 = WorldTeleportTree::from_json(pvVar3);
    pvVar3 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator[](this_00,1);
    local_b8.second = WorldTeleportTree::from_json(pvVar3);
    pWVar4->_paired_map_id = (local_b8.second)->_map_id;
    (local_b8.second)->_paired_map_id = pWVar4->_map_id;
    __position._M_current =
         (this->_teleport_tree_pairs).
         super__Vector_base<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_b8.first = pWVar4;
    if (__position._M_current ==
        (this->_teleport_tree_pairs).
        super__Vector_base<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::pair<WorldTeleportTree*,WorldTeleportTree*>,std::allocator<std::pair<WorldTeleportTree*,WorldTeleportTree*>>>
      ::_M_realloc_insert<std::pair<WorldTeleportTree*,WorldTeleportTree*>>
                ((vector<std::pair<WorldTeleportTree*,WorldTeleportTree*>,std::allocator<std::pair<WorldTeleportTree*,WorldTeleportTree*>>>
                  *)&this->_teleport_tree_pairs,__position,&local_b8);
    }
    else {
      (__position._M_current)->first = pWVar4;
      (__position._M_current)->second = local_b8.second;
      pppVar1 = &(this->_teleport_tree_pairs).
                 super__Vector_base<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&local_50);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_a8);
  return;
}

Assistant:

void RandomizerWorld::load_teleport_trees()
{
    Json trees_json = Json::parse(WORLD_TELEPORT_TREES_JSON);
    for(const Json& tree_pair_json : trees_json)
    {
        WorldTeleportTree* tree_1 = WorldTeleportTree::from_json(tree_pair_json[0]);
        WorldTeleportTree* tree_2 = WorldTeleportTree::from_json(tree_pair_json[1]);
        tree_1->paired_map_id(tree_2->map_id());
        tree_2->paired_map_id(tree_1->map_id());
        _teleport_tree_pairs.emplace_back(std::make_pair(tree_1, tree_2));
    }
}